

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O3

void __thiscall flow::BasicBlock::~BasicBlock(BasicBlock *this)

{
  pointer ppBVar1;
  FILE *__stream;
  pointer ppBVar2;
  allocator<char> local_41;
  undefined1 local_40 [40];
  
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__BasicBlock_001af558;
  if ((this->code_).
      super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->code_).
      super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      remove((BasicBlock *)local_40,(char *)this);
      if ((_func_int **)local_40._0_8_ != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_40._0_8_ + 8))();
      }
      local_40._0_8_ = (_func_int **)0x0;
    } while ((this->code_).
             super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->code_).
             super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  __stream = _stderr;
  if ((this->predecessors_).
      super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->predecessors_).
      super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppBVar2 = (this->successors_).
              super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppBVar1 = (this->successors_).
              super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppBVar2 != ppBVar1) {
      do {
        unlinkSuccessor(this,*ppBVar2);
        ppBVar2 = ppBVar2 + 1;
      } while (ppBVar2 != ppBVar1);
      ppBVar2 = (this->successors_).
                super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    if (ppBVar2 != (pointer)0x0) {
      operator_delete(ppBVar2,(long)(this->successors_).
                                    super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppBVar2);
    }
    ppBVar2 = (this->predecessors_).
              super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppBVar2 != (pointer)0x0) {
      operator_delete(ppBVar2,(long)(this->predecessors_).
                                    super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppBVar2);
    }
    std::
    vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
    ::~vector(&this->code_);
    Value::~Value(&this->super_Value);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_40 + 8),
             "Cannot remove a BasicBlock that another BasicBlock still refers to.",&local_41);
  fprintf(__stream,"%s\n",local_40._8_8_);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  abort();
}

Assistant:

BasicBlock::~BasicBlock() {
  // XXX we *must* destruct the code in reverse order to ensure proper release
  // The validity checks will fail otherwise.
  while (!empty()) {
    remove(back());
  }

  FLOW_ASSERT(predecessors_.empty(),
              "Cannot remove a BasicBlock that another BasicBlock still refers to.");

  for (BasicBlock* bb : predecessors_) {
    bb->unlinkSuccessor(this);
  }

  for (BasicBlock* bb : successors_) {
    unlinkSuccessor(bb);
  }
}